

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week8-midterm.cpp
# Opt level: O2

array<float,_4UL> reverse<std::array<float,4ul>>(array<float,_4UL> *container)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  array<float,_4UL> aVar4;
  array<float,_4UL> c;
  
  pfVar2 = c._M_elems;
  c._M_elems._0_8_ = *(undefined8 *)container->_M_elems;
  c._M_elems._8_8_ = *(undefined8 *)(container->_M_elems + 2);
  for (lVar3 = 3; lVar3 != 1; lVar3 = lVar3 + -1) {
    fVar1 = *pfVar2;
    *pfVar2 = c._M_elems[lVar3];
    c._M_elems[lVar3] = fVar1;
    pfVar2 = pfVar2 + 1;
  }
  aVar4._M_elems[0] = c._M_elems[0];
  aVar4._M_elems[1] = c._M_elems[1];
  aVar4._M_elems[2] = c._M_elems[2];
  aVar4._M_elems[3] = c._M_elems[3];
  return (array<float,_4UL>)aVar4._M_elems;
}

Assistant:

auto reverse(const Container& container)
{
    auto c = container;
    auto sz = c.size();
    for(auto i=0; i<sz/2; ++i)
    {
        auto t = c[i];
        c[i] = c[sz-i-1];
        c[sz-i-1] = t;
    }
    return c;
}